

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O1

void __thiscall
Fl_Graphics_Driver::yxline(Fl_Graphics_Driver *this,int x,int y,int y1,int x2,int y3)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined2 uVar4;
  XPoint p [4];
  undefined2 local_18;
  undefined2 local_16;
  undefined2 local_14;
  undefined2 local_12;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  
  iVar2 = 1;
  if (1 < fl_line_width_) {
    iVar2 = fl_line_width_;
  }
  iVar3 = 0x7fff - iVar2;
  iVar2 = -iVar2;
  iVar1 = x;
  if (iVar3 < x) {
    iVar1 = iVar3;
  }
  uVar4 = (undefined2)iVar2;
  local_18 = (short)iVar1;
  if (x < iVar2) {
    local_18 = uVar4;
  }
  iVar1 = y;
  if (iVar3 < y) {
    iVar1 = iVar3;
  }
  local_16 = (short)iVar1;
  if (y < iVar2) {
    local_16 = uVar4;
  }
  local_12 = (short)y1;
  if (iVar3 < y1) {
    local_12 = (short)iVar3;
  }
  if (y1 < iVar2) {
    local_12 = uVar4;
  }
  local_10 = (short)x2;
  if (iVar3 < x2) {
    local_10 = (short)iVar3;
  }
  if (x2 < iVar2) {
    local_10 = uVar4;
  }
  if (y3 <= iVar3) {
    iVar3 = y3;
  }
  local_a = (short)iVar3;
  if (y3 < iVar2) {
    local_a = uVar4;
  }
  local_14 = local_18;
  local_e = local_12;
  local_c = local_10;
  XDrawLines(fl_display,fl_window,fl_gc,&local_18,4,0);
  return;
}

Assistant:

void Fl_Graphics_Driver::yxline(int x, int y, int y1, int x2, int y3) {
#if defined(USE_X11)
  XPoint p[4];
  p[0].x = p[1].x = clip_x(x);  p[0].y = clip_x(y);
  p[1].y = p[2].y = clip_x(y1); p[2].x = p[3].x = clip_x(x2);
  p[3].y = clip_x(y3);
  XDrawLines(fl_display, fl_window, fl_gc, p, 4, 0);
#elif defined(WIN32)
  if(y3<y1) y3--;
  else y3++;
  MoveToEx(fl_gc, x, y, 0L); 
  LineTo(fl_gc, x, y1);
  LineTo(fl_gc, x2, y1);
  LineTo(fl_gc, x2, y3);
#elif defined(__APPLE_QUARTZ__)
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, true);
  CGContextMoveToPoint(fl_gc, x, y);
  CGContextAddLineToPoint(fl_gc, x, y1);
  CGContextAddLineToPoint(fl_gc, x2, y1);
  CGContextAddLineToPoint(fl_gc, x2, y3);
  CGContextStrokePath(fl_gc);
  if (Fl_Display_Device::high_resolution()) {
    CGContextFillRect(fl_gc, CGRectMake(x  -  fl_quartz_line_width_/2, y-0.5, fl_quartz_line_width_, 1));
    CGContextFillRect(fl_gc, CGRectMake(x2  -  fl_quartz_line_width_/2, y3-0.5, fl_quartz_line_width_, 1));
  }
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}